

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

ON_DimStyle * __thiscall ON_BinaryArchive::Internal_ArchiveCurrentDimStyle(ON_BinaryArchive *this)

{
  bool bVar1;
  byte bVar2;
  LengthUnitSystem u1;
  bool bVar3;
  uint uVar4;
  ON_UUID *b;
  ON_DimStyle *pOVar5;
  bool bVar6;
  ON_DimStyle *pOVar7;
  ulong uVar8;
  ON_DimStyle *unaff_R13;
  ON_DimStyle *unaff_R14;
  ON_DimStyle *pOVar9;
  double dVar10;
  undefined8 uVar11;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  ON_DimStyle *current_ds;
  LengthUnitSystem local_6d;
  ON_DimStyle *local_68;
  ON_DimStyle *local_60;
  ON_UUID local_58;
  double local_48;
  undefined8 uStack_40;
  ON_DimStyle *local_38;
  
  if (this->m_archive_3dm_settings == (ON_3dmSettings *)0x0) {
    local_6d = Unset;
    goto LAB_003a54aa;
  }
  local_6d = ON_UnitSystem::UnitSystem
                       (&(this->m_archive_3dm_settings->m_ModelUnitsAndTolerances).m_unit_system);
  local_58 = ON_3dmSettings::CurrentDimensionStyleId(this->m_archive_3dm_settings);
  bVar1 = ::operator!=(&ON_nil_uuid,&local_58);
  local_60 = unaff_R13;
  if (bVar1) {
    bVar2 = 2;
    if ((this->m_archive_dim_style_table).m_count != 0) {
      uVar8 = 0;
      do {
        pOVar9 = (this->m_archive_dim_style_table).m_a[uVar8];
        bVar1 = ON_ModelComponent::ParentIdIsNotNil(&pOVar9->super_ON_ModelComponent);
        bVar2 = 4;
        if (!bVar1) {
          b = ON_ModelComponent::Id(&pOVar9->super_ON_ModelComponent);
          bVar2 = ::operator==(&local_58,b);
          if ((bool)bVar2) {
            unaff_R13 = pOVar9;
          }
        }
      } while (((bVar2 & 3) == 0) &&
              (uVar8 = uVar8 + 1, bVar2 = 2, uVar8 < (uint)(this->m_archive_dim_style_table).m_count
              ));
    }
    local_60 = unaff_R13;
    unaff_R14 = unaff_R13;
    if (bVar2 == 2) goto LAB_003a52ac;
  }
  else {
LAB_003a52ac:
    uVar4 = ON_3dmSettings::CurrentDimensionStyleIndex(this->m_archive_3dm_settings);
    if ((-1 < (int)uVar4) && ((int)uVar4 < (this->m_archive_dim_style_table).m_count)) {
      pOVar9 = (this->m_archive_dim_style_table).m_a[uVar4];
      if ((pOVar9 != (ON_DimStyle *)0x0) &&
         (bVar1 = ON_ModelComponent::ParentIdIsNotNil(&pOVar9->super_ON_ModelComponent), bVar1)) {
        bVar2 = 1;
        unaff_R14 = (this->m_archive_dim_style_table).m_a[uVar4];
        goto LAB_003a54a2;
      }
    }
    bVar1 = ON::IsTerrestrialLengthUnit(local_6d);
    bVar2 = 0;
    unaff_R14 = local_60;
    if (bVar1) {
      bVar2 = 5;
      if ((this->m_archive_dim_style_table).m_count == 0) {
        pOVar9 = (ON_DimStyle *)0x0;
        local_68 = (ON_DimStyle *)0x0;
      }
      else {
        dVar10 = 1e+300;
        uVar11 = 0;
        uVar8 = 0;
        local_68 = (ON_DimStyle *)0x0;
        pOVar9 = (ON_DimStyle *)0x0;
        do {
          pOVar5 = (this->m_archive_dim_style_table).m_a[uVar8];
          local_48 = dVar10;
          uStack_40 = uVar11;
          bVar1 = ON_ModelComponent::ParentIdIsNotNil(&pOVar5->super_ON_ModelComponent);
          bVar2 = 7;
          dVar10 = local_48;
          uVar11 = uStack_40;
          pOVar7 = local_60;
          if ((!bVar1) &&
             (bVar1 = ON_DimStyle::UnitSystemIsSet(pOVar5), dVar10 = local_48, uVar11 = uStack_40,
             bVar1)) {
            u1 = ON_DimStyle::UnitSystem(pOVar5);
            bVar2 = 1;
            dVar10 = local_48;
            uVar11 = uStack_40;
            pOVar7 = pOVar5;
            if (u1 != local_6d) {
              pOVar7 = pOVar9;
              if ((this->m_archive_current_dim_style == (ON_DimStyle *)0x0) &&
                 (bVar1 = ON::IsUnitedStatesCustomaryLengthUnit(local_6d), pOVar7 = pOVar5,
                 u1 != Inches || !bVar1)) {
                bVar1 = ON::IsMetricLengthUnit(local_6d);
                pOVar7 = pOVar9;
                if (bVar1) {
                  pOVar7 = pOVar5;
                }
                if (u1 != Millimeters) {
                  pOVar7 = pOVar9;
                }
              }
              local_38 = pOVar7;
              dVar10 = ON::UnitScale(local_6d,u1);
              uVar11 = extraout_XMM0_Qb;
              if (dVar10 < 1.0) {
                dVar10 = ON::UnitScale(u1,local_6d);
                uVar11 = extraout_XMM0_Qb_00;
              }
              if (dVar10 <= 1.0 || local_48 <= dVar10) {
                dVar10 = local_48;
                uVar11 = uStack_40;
                pOVar5 = local_68;
              }
              local_68 = pOVar5;
              bVar2 = 0;
              pOVar9 = local_38;
              pOVar7 = local_60;
            }
          }
          local_60 = pOVar7;
          if ((bVar2 != 7) && (bVar2 != 0)) goto LAB_003a547e;
          uVar8 = uVar8 + 1;
        } while (uVar8 < (uint)(this->m_archive_dim_style_table).m_count);
        bVar2 = 5;
      }
LAB_003a547e:
      unaff_R14 = local_60;
      if (((bVar2 == 5) && (bVar2 = 1, unaff_R14 = pOVar9, pOVar9 == (ON_DimStyle *)0x0)) &&
         (bVar2 = local_68 != (ON_DimStyle *)0x0, unaff_R14 = local_60, (bool)bVar2)) {
        unaff_R14 = local_68;
      }
    }
  }
LAB_003a54a2:
  if (bVar2 != 0) {
    return unaff_R14;
  }
LAB_003a54aa:
  bVar1 = (this->m_archive_dim_style_table).m_count != 0;
  if (bVar1) {
    uVar8 = 0;
    do {
      pOVar9 = (this->m_archive_dim_style_table).m_a[uVar8];
      bVar3 = ON_ModelComponent::ParentIdIsNotNil(&pOVar9->super_ON_ModelComponent);
      bVar6 = true;
      if (!bVar3) {
        bVar3 = ON_DimStyle::UnitSystemIsSet(pOVar9);
        bVar6 = !bVar3;
        if (bVar3) {
          unaff_R14 = pOVar9;
        }
      }
      if (!bVar6) break;
      uVar8 = uVar8 + 1;
      bVar1 = uVar8 < (uint)(this->m_archive_dim_style_table).m_count;
    } while (bVar1);
  }
  if (!bVar1) {
    bVar1 = ON::IsUnitedStatesCustomaryLengthUnit(local_6d);
    if (bVar1) {
      pOVar9 = &ON_DimStyle::DefaultInchDecimal;
    }
    else {
      bVar1 = ON::IsMetricLengthUnit(local_6d);
      if (bVar1) {
        pOVar9 = &ON_DimStyle::DefaultMillimeterSmall;
      }
      else {
        pOVar9 = &ON_DimStyle::Default;
      }
    }
    pOVar5 = (ON_DimStyle *)operator_new(0x450);
    ON_DimStyle::ON_DimStyle(pOVar5,pOVar9);
    local_58._0_8_ = pOVar5;
    ON_ModelComponent::SetId((ON_ModelComponent *)pOVar5);
    ON_ModelComponent::SetIndex
              ((ON_ModelComponent *)local_58._0_8_,(this->m_archive_dim_style_table).m_count);
    if (this->m_mode == read3dm) {
      Internal_Read3dmUpdateManifest(this,(ON_ModelComponent *)local_58._0_8_);
    }
    else {
      ON_ComponentManifest::AddComponentToManifest
                (&this->m_manifest,(ON_ModelComponent *)local_58._0_8_,true,(ON_wString *)0x0);
    }
    ON_SimpleArray<ON_DimStyle_*>::Append
              (&this->m_archive_dim_style_table,(ON_DimStyle **)&local_58);
    unaff_R14 = (ON_DimStyle *)local_58._0_8_;
  }
  return unaff_R14;
}

Assistant:

const ON_DimStyle* ON_BinaryArchive::Internal_ArchiveCurrentDimStyle()
{
  ON::LengthUnitSystem model_unit_system = ON::LengthUnitSystem::Unset;
  if (nullptr != m_archive_3dm_settings)
  {
    model_unit_system = m_archive_3dm_settings->m_ModelUnitsAndTolerances.m_unit_system.UnitSystem();
    const ON_UUID id = m_archive_3dm_settings->CurrentDimensionStyleId();
    if (ON_nil_uuid != id)
    {
      for (unsigned int i = 0; i < m_archive_dim_style_table.UnsignedCount(); i++)
      {
        const ON_DimStyle* archive_dim_style = m_archive_dim_style_table[i];
        if (archive_dim_style->ParentIdIsNotNil())
          continue;
        if ( id == archive_dim_style->Id())
        {
          return archive_dim_style;
          break;
        }
      }
    }

    const int index = m_archive_3dm_settings->CurrentDimensionStyleIndex();
    if (index >= 0 && index < m_archive_dim_style_table.Count() && nullptr != m_archive_dim_style_table[index] && m_archive_dim_style_table[index]->ParentIdIsNotNil() )
      return m_archive_dim_style_table[index];

    if (ON::IsTerrestrialLengthUnit(model_unit_system))
    {
      double unit_scale = 1e300;
      const ON_DimStyle* inch_mm_ds = nullptr;
      const ON_DimStyle* unit_scale_ds = nullptr;
      for (unsigned int i = 0; i < m_archive_dim_style_table.UnsignedCount(); i++)
      {
        const ON_DimStyle* archive_dim_style = m_archive_dim_style_table[i];
        if (archive_dim_style->ParentIdIsNotNil())
          continue;
        if (false == archive_dim_style->UnitSystemIsSet())
          continue;

        const ON::LengthUnitSystem ds_unit_system = archive_dim_style->UnitSystem();
        if (ds_unit_system == model_unit_system)
          return archive_dim_style;

        if (nullptr == m_archive_current_dim_style)
        {
          if (ON::IsUnitedStatesCustomaryLengthUnit(model_unit_system) && ON::LengthUnitSystem::Inches == ds_unit_system)
          {
            inch_mm_ds = archive_dim_style;
          }
          else if (ON::IsMetricLengthUnit(model_unit_system) && ON::LengthUnitSystem::Millimeters == ds_unit_system)
          {
            inch_mm_ds = archive_dim_style;
          }
        }

        double s = ON::UnitScale(model_unit_system, ds_unit_system);
        if (s < 1.0)
          s = ON::UnitScale(ds_unit_system, model_unit_system);
        if (s > 1.0 && s < unit_scale)
        {
          unit_scale_ds = archive_dim_style;
          unit_scale = s;
        }
      }
      if (nullptr != inch_mm_ds)
        return inch_mm_ds;
      if (nullptr != unit_scale_ds)
        return unit_scale_ds;
    }
  }

  for (unsigned int i = 0; i < m_archive_dim_style_table.UnsignedCount(); i++)
  {
    const ON_DimStyle* archive_dim_style = m_archive_dim_style_table[i];
    if (archive_dim_style->ParentIdIsNotNil())
      continue;
    if (false == archive_dim_style->UnitSystemIsSet())
      continue;
    return archive_dim_style;
  }
  
  const ON_DimStyle* system_ds;
  if (ON::IsUnitedStatesCustomaryLengthUnit(model_unit_system))
    system_ds = &ON_DimStyle::DefaultInchDecimal;  
  else if (ON::IsMetricLengthUnit(model_unit_system))
    system_ds = &ON_DimStyle::DefaultMillimeterSmall;
  else
    system_ds = &ON_DimStyle::Default;

  // invent a current dimstyle. Happens when reading files written by Rhino 1.1.
  ON_DimStyle* current_ds = new ON_DimStyle(*system_ds);
  current_ds->SetId();
  current_ds->SetIndex(m_archive_dim_style_table.Count());
  if ( ON::archive_mode::read3dm == Mode())
    Internal_Read3dmUpdateManifest(*current_ds);
  else
    m_manifest.AddComponentToManifest(*current_ds, true, nullptr);

  m_archive_dim_style_table.Append(current_ds);

  return current_ds;
}